

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.hpp
# Opt level: O0

bool __thiscall czh::node::Node::get<bool>(Node *this,source_location *l)

{
  bool bVar1;
  Node *pNVar2;
  source_location local_170;
  string local_168;
  allocator<char> local_141;
  basic_string_view<char,_std::char_traits<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  source_location local_90;
  allocator<char> local_81;
  string local_80;
  source_location local_50;
  Reference local_48;
  Node *local_30;
  Node *ptr;
  Value *value;
  source_location *l_local;
  Node *this_local;
  
  value = (Value *)l;
  l_local = (source_location *)this;
  assert_value(this,l);
  ptr = (Node *)std::get<czh::value::Value,czh::node::Node::NodeData,czh::value::Value>(&this->data)
  ;
  bVar1 = czh::value::Value::is<czh::value::Reference>((Value *)ptr);
  if ((bVar1) &&
     (bVar1 = std::type_info::operator==
                        ((type_info *)&bool::typeinfo,(type_info *)&czh::value::Reference::typeinfo)
     , ((bVar1 ^ 0xffU) & 1) != 0)) {
    local_50._M_impl = (__impl *)&PTR_s__workspace_llm4binary_github_lic_00277398;
    czh::value::Value::get<czh::value::Reference>(&local_48,(Value *)ptr,&local_50);
    pNVar2 = get_end_of_list_of_ref(this,&local_48,(source_location *)value);
    czh::value::Reference::~Reference(&local_48);
    local_30 = pNVar2;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,"Can not get a circular reference.",&local_81);
    assert_true(pNVar2 != (Node *)0x0,&local_80,&this->czh_token,(source_location *)value);
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator(&local_81);
    local_90._M_impl = (__impl *)&PTR_s__workspace_llm4binary_github_lic_002773b0;
    this_local._7_1_ = get<bool>(local_30,&local_90);
  }
  else {
    bVar1 = czh::value::Value::can_get<bool>((Value *)ptr);
    if (!bVar1) {
      local_140._M_len = 0x39;
      local_140._M_str = "std::string_view czh::value::details::nameof() [T = bool]";
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                ((string *)&local_130,&local_140,&local_141);
      std::operator+(&local_110,"The value is not \'",&local_130);
      std::operator+(&local_f0,&local_110,"\'.[Actual T = \'");
      czh::value::Value::get_typename_abi_cxx11_(&local_168,(Value *)ptr);
      std::operator+(&local_d0,&local_f0,&local_168);
      std::operator+(&local_b0,&local_d0,"\'].");
      report_error(&local_b0,&this->czh_token,(source_location *)value);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_168);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_130);
      std::allocator<char>::~allocator(&local_141);
    }
    local_170._M_impl = (__impl *)&PTR_s__workspace_llm4binary_github_lic_002773c8;
    this_local._7_1_ = czh::value::Value::get<bool>((Value *)ptr,&local_170);
  }
  return this_local._7_1_;
}

Assistant:

T get(const std::source_location &l =
    std::source_location::current()) const
    {
      assert_value(l);
      auto &value = std::get<Value>(data);
      if (value.is<value::Reference>() && typeid(T) != typeid(value::Reference))
      {
        auto ptr = get_end_of_list_of_ref(value.get<value::Reference>(), l);
        assert_true(ptr != nullptr, "Can not get a circular reference.", czh_token, l);
        return ptr->get<T>();
      }
  
      if (!value.can_get<T>())
      {
        report_error("The value is not '" + std::string(value::details::nameof<T>()) + "'.[Actual T = '"
                     + value.get_typename() + "'].", czh_token, l);
      }
      return value.get<T>();
    }